

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveSparse(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *feastol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  cpp_dec_float<100U,_int,_void> *in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int i;
  int idx;
  int bstI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cpen;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *fTest;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  longlong in_stack_fffffffffffffcd8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffce0;
  undefined1 local_2d8 [80];
  undefined1 local_288 [16];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd98;
  undefined1 local_238 [80];
  undefined1 local_1e8 [80];
  uint local_198;
  int local_194;
  int local_190;
  undefined4 local_18c;
  undefined1 local_188 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 local_128 [96];
  undefined8 local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  uint *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined4 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<100U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<100U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_b0 = local_128;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::fTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            **)((in_RDI->data)._M_elems + 4));
  local_130 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x5cadbb);
  local_138 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x5caddb);
  local_18c = 0;
  local_b8 = local_188;
  local_c0 = &local_18c;
  local_c8 = 0;
  local_38 = local_c0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_RDI);
  local_190 = -1;
  local_194 = -1;
  local_198 = IdxSet::size((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xed0));
  uVar4 = extraout_RDX;
  while (local_198 = local_198 - 1, -1 < (int)local_198) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xed0),
                           (char *)(ulong)local_198,(int)uVar4);
    local_194 = (int)pcVar2;
    local_48 = local_130 + local_194;
    local_40 = local_128;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RSI);
    local_20 = local_1e8;
    local_28 = in_RSI;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RSI);
    local_10 = local_1e8;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
    local_8 = local_1e8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate(in_RDI);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_RSI,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5caf88);
    if (tVar1) {
      local_a0 = local_288;
      local_a8 = local_128;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
      local_98 = local_138 + local_194;
      local_90 = local_2d8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
      local_80 = &stack0xfffffffffffffcd8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_70 = local_128;
      local_78 = local_238;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RSI);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_RSI,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5cb09e);
      uVar4 = extraout_RDX_00;
      if (tVar1) {
        local_50 = local_188;
        local_58 = local_128;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RSI);
        local_190 = local_194;
        local_68 = local_138 + local_194;
        local_60 = in_RDI[1].data._M_elems + 0xc;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RSI);
        uVar4 = extraout_RDX_01;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xed0),
                     (char *)(ulong)local_198);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xf50),
                          local_194);
      *piVar3 = 0;
      uVar4 = extraout_RDX_02;
    }
  }
  return local_190;
}

Assistant:

int SPxDevexPR<R>::selectLeaveSparse(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int idx = -1;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return bstI;
}